

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall hgdb::json::SymbolTable::compress_var(SymbolTable *this)

{
  pointer puVar1;
  reference pvVar2;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  __node_base _Var3;
  pointer puVar4;
  size_type id;
  VariableCount v_count;
  VarAssign var_assign;
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ids;
  unsigned_long local_110;
  ScopeVisitor local_108;
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_100;
  pair<const_hgdb::json::Variable,_unsigned_long> local_c8;
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_108._vptr_ScopeVisitor = (_func_int **)&PTR_handle_004e9130;
  local_100._M_buckets = &local_100._M_single_bucket;
  local_100._M_bucket_count = 1;
  local_100._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_100._M_element_count = 0;
  local_100._M_rehash_policy._M_max_load_factor = 1.0;
  local_100._M_rehash_policy._M_next_resize = 0;
  local_100._M_single_bucket = (__node_base_ptr)0x0;
  puVar4 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      ScopeVisitor::visit(&local_108,
                          (ScopeBase *)
                          (puVar4->_M_t).
                          super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                          .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::reserve
            (&this->variables_,local_100._M_element_count);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (local_100._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var3._M_nxt = local_100._M_before_begin._M_nxt;
    do {
      std::pair<const_hgdb::json::Variable,_unsigned_long>::pair
                (&local_c8,(pair<const_hgdb::json::Variable,_unsigned_long> *)(_Var3._M_nxt + 1));
      if (1 < local_c8.second) {
        local_110 = ((long)(this->variables_).
                           super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->variables_).
                           super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        pvVar2 = std::vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>>::
                 emplace_back<hgdb::json::Variable_const&>
                           ((vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>> *)
                            &this->variables_,&local_c8.first);
        (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_110;
        (pvVar2->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
        std::
        _Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<hgdb::json::Variable&,unsigned_long&>
                  ((_Hashtable<hgdb::json::Variable,std::pair<hgdb::json::Variable_const,unsigned_long>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<hgdb::json::Variable>,hgdb::json::Variable::hash_fn,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,pvVar2,&local_110);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first.value._M_dataplus._M_p != &local_c8.first.value.field_2) {
        operator_delete(local_c8.first.value._M_dataplus._M_p,
                        local_c8.first.value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.first.name._M_dataplus._M_p != &local_c8.first.name.field_2) {
        operator_delete(local_c8.first.name._M_dataplus._M_p,
                        local_c8.first.name.field_2._M_allocated_capacity + 1);
      }
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
  }
  local_c8.first.name._M_dataplus._M_p = (pointer)&PTR_handle_004e9180;
  local_c8.first.name._M_string_length = (size_type)&local_68;
  puVar4 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      ScopeVisitor::visit((ScopeVisitor *)&local_c8,
                          (ScopeBase *)
                          (puVar4->_M_t).
                          super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
                          .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  std::
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  local_108._vptr_ScopeVisitor = (_func_int **)&PTR_handle_004e9130;
  std::
  _Hashtable<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_100);
  return;
}

Assistant:

void compress_var() {
        // first pass collect all the variables
        VariableCount v_count;
        for (auto &m : modules_) {
            v_count.visit(m.get());
        }
        // compute the global variable pull
        variables_.reserve(v_count.count.size());
        std::unordered_map<Variable, uint64_t, Variable::hash_fn> ids;
        for (auto [var, c] : v_count.count) {
            if (c > 1) {
                auto id = variables_.size();
                auto &var_id = variables_.emplace_back(var);
                var_id.id = id;
                ids.emplace(var_id, id);
            }
        }

        // second pass to assign
        VarAssign var_assign(ids);
        for (auto &m : modules_) {
            var_assign.visit(m.get());
        }
    }